

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<StatementNode,_std::default_delete<StatementNode>_> __thiscall
Parser::parseReturnStatement(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Mark MVar2;
  _Alloc_hider _Var3;
  Mark *pMVar4;
  Token *pTVar5;
  istream *piVar6;
  Tokenizer *in_RSI;
  string local_48;
  
  pMVar4 = Stream::getMark(&in_RSI->stream_);
  MVar2 = *pMVar4;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Expected return statement!","");
  expectToken((Parser *)in_RSI,KeywordRet,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = Tokenizer::peek(in_RSI);
  if (pTVar5->type == Backslash) {
    parseLambda((Parser *)&local_48);
  }
  else {
    parseArithmeticExpression((Parser *)&local_48);
  }
  _Var3._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Expected semicolon!","");
  expectToken((Parser *)in_RSI,Semicolon,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  piVar6 = (istream *)operator_new(0x18);
  *(undefined ***)piVar6 = &PTR__ReturnNode_001f4fe8;
  *(pointer *)(piVar6 + 0x10) = _Var3._M_p;
  *(Mark *)(piVar6 + 8) = MVar2;
  (this->tokenizer_).stream_.is_ = piVar6;
  return (__uniq_ptr_data<StatementNode,_std::default_delete<StatementNode>,_true,_true>)
         (__uniq_ptr_data<StatementNode,_std::default_delete<StatementNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<StatementNode> Parser::parseReturnStatement()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordRet, "Expected return statement!");
  std::unique_ptr<ExpressionNode> value = nullptr;

  if(tokenizer_.peek().type == TokenType::Backslash)
    value = parseLambda();
  else
    value = parseArithmeticExpression();

  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<ReturnNode>(std::move(value));
  node->setMark(mark);
  return node;
}